

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int op_http_stream_seek(void *_stream,opus_int64 _offset,int _whence)

{
  OpusHTTPConn **_pnext;
  __time_t *p_Var1;
  opus_int32 oVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int _just_read_ahead;
  OpusHTTPConn **_pnext_00;
  OpusHTTPConn **_pnext_01;
  OpusHTTPConn *pOVar7;
  OpusHTTPConn *_conn;
  OpusHTTPConn **ppOVar8;
  long lVar9;
  op_time seek_time;
  
  if (*(int *)((long)_stream + 0x280) == 0) {
    return -1;
  }
  lVar9 = *(long *)((long)_stream + 0x260);
  lVar5 = (long)*(int *)((long)_stream + 0x27c);
  lVar6 = lVar9;
  if (-1 < lVar5) {
    lVar6 = *(long *)((long)_stream + lVar5 * 0x60);
  }
  if (_whence == 2) {
    if (0x7fffffffffffffff - lVar9 < _offset || -_offset != lVar9 && _offset <= -lVar9) {
      return -1;
    }
    _offset = _offset + lVar9;
  }
  else if (_whence == 1) {
    if (0x7fffffffffffffff - lVar6 < _offset || -_offset != lVar6 && _offset <= -lVar6) {
      return -1;
    }
    _offset = _offset + lVar6;
  }
  else {
    if (_whence != 0) {
      return -1;
    }
    if (_offset < 0) {
      return -1;
    }
  }
  if (*(int *)((long)_stream + 0x27c) < 0) {
    op_time_get(&seek_time);
  }
  else {
    op_http_conn_read_rate_update((OpusHTTPConn *)((long)_stream + lVar5 * 0x60));
    p_Var1 = (__time_t *)((long)_stream + lVar5 * 0x60 + 0x30);
    seek_time.tv_sec = *p_Var1;
    seek_time.tv_nsec = p_Var1[1];
  }
  if (_offset < lVar9) {
    _pnext = (OpusHTTPConn **)((long)_stream + 400);
    ppOVar8 = _pnext;
    while( true ) {
      pOVar7 = *ppOVar8;
      if (pOVar7 == (OpusHTTPConn *)0x0) break;
      oVar2 = op_time_diff_ms(&seek_time,&pOVar7->read_time);
      if ((oVar2 < 0x1389) && (6 < pOVar7->nrequests_left)) {
        iVar3 = op_http_conn_estimate_available(pOVar7);
        if (((pOVar7->pos <= _offset) && (_offset - pOVar7->pos <= (long)iVar3)) &&
           (((&pOVar7->end_pos)[(ulong)(-1 < pOVar7->next_pos) * 2] < 0 ||
            (_offset < (&pOVar7->end_pos)[(ulong)(-1 < pOVar7->next_pos) * 2])))) {
          iVar3 = op_http_conn_read_ahead((OpusHTTPStream *)_stream,pOVar7,1,_offset);
          if (iVar3 < 0) goto LAB_0010d65d;
          *ppOVar8 = pOVar7->next;
          goto LAB_0010d6de;
        }
        ppOVar8 = &pOVar7->next;
      }
      else {
LAB_0010d65d:
        op_http_conn_close((OpusHTTPStream *)_stream,pOVar7,ppOVar8,1);
      }
    }
    iVar3 = *(int *)((long)_stream + 0x284);
    _conn = (OpusHTTPConn *)0x0;
    ppOVar8 = _pnext;
    _pnext_00 = (OpusHTTPConn **)0x0;
    while( true ) {
      while( true ) {
        _pnext_01 = ppOVar8;
        pOVar7 = *_pnext_01;
        if (pOVar7 == (OpusHTTPConn *)0x0) {
          pOVar7 = *(OpusHTTPConn **)((long)_stream + 0x198);
          if (pOVar7 == (OpusHTTPConn *)0x0) {
            op_http_conn_close((OpusHTTPStream *)_stream,_conn,_pnext_00,1);
            pOVar7 = *(OpusHTTPConn **)((long)_stream + 0x198);
          }
          iVar4 = 0;
          iVar3 = op_http_conn_open_pos
                            ((OpusHTTPStream *)_stream,pOVar7,_offset,-(uint)(iVar3 == 0) | 0x8000);
          if (iVar3 < 0) {
            op_http_conn_close((OpusHTTPStream *)_stream,pOVar7,_pnext,1);
            iVar4 = -1;
          }
          return iVar4;
        }
        lVar9 = (long)*(int *)((long)_stream + 0x290) * pOVar7->read_rate >> 0xb;
        if (lVar9 < 0x8001) {
          lVar9 = 0x8000;
        }
        iVar4 = op_http_conn_estimate_available(pOVar7);
        lVar6 = pOVar7->pos;
        lVar5 = (&pOVar7->end_pos)[(ulong)(-1 < pOVar7->next_pos) * 2];
        if ((((lVar6 <= _offset) && ((_offset - lVar6) - (long)iVar4 <= lVar9)) &&
            ((_just_read_ahead = 1, lVar5 < 0 || (_offset < lVar5)))) ||
           (((iVar3 != 0 && (-1 < lVar5)) &&
            (_just_read_ahead = 0, lVar5 - (lVar6 + iVar4) <= lVar9)))) break;
        _conn = pOVar7;
        ppOVar8 = &pOVar7->next;
        _pnext_00 = _pnext_01;
      }
      iVar4 = op_http_conn_read_ahead((OpusHTTPStream *)_stream,pOVar7,_just_read_ahead,_offset);
      if (-1 < iVar4) break;
      op_http_conn_close((OpusHTTPStream *)_stream,pOVar7,_pnext_01,1);
      ppOVar8 = _pnext_01;
    }
    *_pnext_01 = pOVar7->next;
LAB_0010d6de:
    pOVar7->next = *(OpusHTTPConn **)((long)_stream + 400);
    *(OpusHTTPConn **)((long)_stream + 400) = pOVar7;
    *(int *)((long)_stream + 0x27c) = (int)(((long)pOVar7 - (long)_stream) / 0x60);
  }
  else {
    *(undefined4 *)((long)_stream + 0x27c) = 0xffffffff;
    *(opus_int64 *)((long)_stream + 0x268) = _offset;
  }
  return 0;
}

Assistant:

static int op_http_stream_seek(void *_stream,opus_int64 _offset,int _whence){
  op_time          seek_time;
  OpusHTTPStream  *stream;
  OpusHTTPConn    *conn;
  OpusHTTPConn   **pnext;
  OpusHTTPConn    *close_conn;
  OpusHTTPConn   **close_pnext;
  opus_int64       content_length;
  opus_int64       pos;
  int              pipeline;
  int              ci;
  int              ret;
  stream=(OpusHTTPStream *)_stream;
  if(!stream->seekable)return -1;
  content_length=stream->content_length;
  /*If we're seekable, we should have gotten a Content-Length.*/
  OP_ASSERT(content_length>=0);
  ci=stream->cur_conni;
  pos=ci<0?content_length:stream->conns[ci].pos;
  switch(_whence){
    case SEEK_SET:{
      /*Check for overflow:*/
      if(_offset<0)return -1;
      pos=_offset;
    }break;
    case SEEK_CUR:{
      /*Check for overflow:*/
      if(_offset<-pos||_offset>OP_INT64_MAX-pos)return -1;
      pos+=_offset;
    }break;
    case SEEK_END:{
      /*Check for overflow:*/
      if(_offset<-content_length||_offset>OP_INT64_MAX-content_length){
        return -1;
      }
      pos=content_length+_offset;
    }break;
    default:return -1;
  }
  /*Mark when we deactivated the active connection.*/
  if(ci>=0){
    op_http_conn_read_rate_update(stream->conns+ci);
    *&seek_time=*&stream->conns[ci].read_time;
  }
  else op_time_get(&seek_time);
  /*If we seeked past the end of the stream, just disable the active
     connection.*/
  if(pos>=content_length){
    stream->cur_conni=-1;
    stream->pos=pos;
    return 0;
  }
  /*First try to find a connection we can use without waiting.*/
  pnext=&stream->lru_head;
  conn=stream->lru_head;
  while(conn!=NULL){
    opus_int64 conn_pos;
    opus_int64 end_pos;
    int        available;
    /*If this connection has been dormant too long or has made too many
       requests, close it.
      This is to prevent us from hitting server limits/firewall timeouts.*/
    if(op_time_diff_ms(&seek_time,&conn->read_time)>
     OP_CONNECTION_IDLE_TIMEOUT_MS
     ||conn->nrequests_left<OP_PIPELINE_MIN_REQUESTS){
      op_http_conn_close(stream,conn,pnext,1);
      conn=*pnext;
      continue;
    }
    available=op_http_conn_estimate_available(conn);
    conn_pos=conn->pos;
    end_pos=conn->end_pos;
    if(conn->next_pos>=0){
      OP_ASSERT(end_pos>=0);
      OP_ASSERT(conn->next_pos==end_pos);
      end_pos=conn->next_end;
    }
    OP_ASSERT(end_pos<0||conn_pos<=end_pos);
    /*Can we quickly read ahead without issuing a new request or waiting for
       any more data?
      If we have an oustanding request, we'll over-estimate the amount of data
       it has available (because we'll count the response headers, too), but
       that probably doesn't matter.*/
    if(conn_pos<=pos&&pos-conn_pos<=available&&(end_pos<0||pos<end_pos)){
      /*Found a suitable connection to re-use.*/
      ret=op_http_conn_read_ahead(stream,conn,1,pos);
      if(OP_UNLIKELY(ret<0)){
        /*The connection might have become stale, so close it and keep going.*/
        op_http_conn_close(stream,conn,pnext,1);
        conn=*pnext;
        continue;
      }
      /*Sucessfully resurrected this connection.*/
      *pnext=conn->next;
      conn->next=stream->lru_head;
      stream->lru_head=conn;
      stream->cur_conni=(int)(conn-stream->conns);
      OP_ASSERT(stream->cur_conni>=0&&stream->cur_conni<OP_NCONNS_MAX);
      return 0;
    }
    pnext=&conn->next;
    conn=conn->next;
  }
  /*Chances are that didn't work, so now try to find one we can use by reading
     ahead a reasonable amount and/or by issuing a new request.*/
  close_pnext=NULL;
  close_conn=NULL;
  pnext=&stream->lru_head;
  conn=stream->lru_head;
  pipeline=stream->pipeline;
  while(conn!=NULL){
    opus_int64 conn_pos;
    opus_int64 end_pos;
    opus_int64 read_ahead_thresh;
    int        available;
    int        just_read_ahead;
    /*Dividing by 2048 instead of 1000 scales this by nearly 1/2, biasing away
       from connection re-use (and roughly compensating for the lag required to
       reopen the TCP window of a connection that's been idle).
      There's no overflow checking here, because it's vanishingly unlikely, and
       all it would do is cause us to make poor decisions.*/
    read_ahead_thresh=OP_MAX(OP_READAHEAD_THRESH_MIN,
     stream->connect_rate*conn->read_rate>>11);
    available=op_http_conn_estimate_available(conn);
    conn_pos=conn->pos;
    end_pos=conn->end_pos;
    if(conn->next_pos>=0){
      OP_ASSERT(end_pos>=0);
      OP_ASSERT(conn->next_pos==end_pos);
      end_pos=conn->next_end;
    }
    OP_ASSERT(end_pos<0||conn_pos<=end_pos);
    /*Can we quickly read ahead without issuing a new request?*/
    just_read_ahead=conn_pos<=pos&&pos-conn_pos-available<=read_ahead_thresh
     &&(end_pos<0||pos<end_pos);
    if(just_read_ahead||pipeline&&end_pos>=0
     &&end_pos-conn_pos-available<=read_ahead_thresh){
      /*Found a suitable connection to re-use.*/
      ret=op_http_conn_read_ahead(stream,conn,just_read_ahead,pos);
      if(OP_UNLIKELY(ret<0)){
        /*The connection might have become stale, so close it and keep going.*/
        op_http_conn_close(stream,conn,pnext,1);
        conn=*pnext;
        continue;
      }
      /*Sucessfully resurrected this connection.*/
      *pnext=conn->next;
      conn->next=stream->lru_head;
      stream->lru_head=conn;
      stream->cur_conni=(int)(conn-stream->conns);
      OP_ASSERT(stream->cur_conni>=0&&stream->cur_conni<OP_NCONNS_MAX);
      return 0;
    }
    close_pnext=pnext;
    close_conn=conn;
    pnext=&conn->next;
    conn=conn->next;
  }
  /*No suitable connections.
    Open a new one.*/
  if(stream->free_head==NULL){
    /*All connections in use.
      Expire one of them (we should have already picked which one when scanning
       the list).*/
    OP_ASSERT(close_conn!=NULL);
    OP_ASSERT(close_pnext!=NULL);
    op_http_conn_close(stream,close_conn,close_pnext,1);
  }
  OP_ASSERT(stream->free_head!=NULL);
  conn=stream->free_head;
  /*If we can pipeline, only request a chunk of data.
    If we're seeking now, there's a good chance we will want to seek again
     soon, and this avoids committing this connection to reading the rest of
     the stream.
    Particularly with SSL or proxies, issuing a new request on the same
     connection can be substantially faster than opening a new one.
    This also limits the amount of data the server will blast at us on this
     connection if we later seek elsewhere and start reading from a different
     connection.*/
  ret=op_http_conn_open_pos(stream,conn,pos,
   pipeline?OP_PIPELINE_CHUNK_SIZE:-1);
  if(OP_UNLIKELY(ret<0)){
    op_http_conn_close(stream,conn,&stream->lru_head,1);
    return -1;
  }
  return 0;
}